

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O1

_Bool inRange(UnitNode *inmate,UnitNode *guard)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = (int)*(float *)((long)inmate->unit + 4);
  iVar1 = *(int *)((long)guard->unit + 4);
  iVar3 = (iVar2 + -1) / 0x50 + (iVar1 + -1) / 0x50 + 2;
  iVar2 = (iVar1 - iVar2) + iVar3 * 0x50;
  iVar1 = -iVar3;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  iVar3 = -iVar2;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  return iVar3 + iVar1 <= *(int *)((long)guard->unit + 0xc);
}

Assistant:

bool inRange(struct UnitNode *inmate, struct UnitNode *guard) {
    int inmatePosition;
    int guardPosition;
    int range;
    int xDifference;
    int yDifference;
    int totalDifference;

    inmatePosition = ((struct Inmate *) inmate->unit)->position;
    guardPosition = ((struct Guard *) guard->unit)->position;
    range = ((struct Guard *) guard->unit)->range;

    yDifference = (((inmatePosition - 1) / MAX_COLS) + 1) -
        -
            (((guardPosition - 1) / MAX_COLS) + 1);
    xDifference = (guardPosition + (yDifference * MAX_COLS)) - inmatePosition;
    yDifference = abs(yDifference);
    xDifference = abs(xDifference);
    totalDifference = xDifference + yDifference;

    return range >= totalDifference;
}